

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * single_abi_cxx11_(void)

{
  int iVar1;
  mapped_type *pmVar2;
  string *in_RDI;
  bool bVar3;
  allocator local_282;
  byte local_281;
  string local_280;
  byte local_259;
  string local_258;
  byte local_231;
  string local_230;
  string local_210;
  byte local_1e9;
  string local_1e8;
  byte local_1c1;
  string local_1c0;
  byte local_199;
  string local_198;
  string local_178;
  byte local_151;
  string local_150;
  byte local_129;
  string local_128;
  byte local_101;
  string local_100;
  string local_e0;
  int local_bc;
  int local_b8;
  int j;
  int i;
  string local_90;
  int local_70;
  byte local_69;
  int i_2;
  string local_38;
  int local_18;
  int local_14;
  int i_1;
  int remain;
  
  setMyCard(my_player_id);
  local_14 = 3;
  do {
    if (local_14 < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"Fail",&local_282);
      std::allocator<char>::~allocator((allocator<char> *)&local_282);
      return in_RDI;
    }
    for (local_18 = 1; local_18 < 5; local_18 = local_18 + 1) {
      makeCardName_abi_cxx11_(&local_38,'F',local_18);
      local_69 = 0;
      pmVar2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&my_active_card_abi_cxx11_,&local_38);
      bVar3 = false;
      if (*pmVar2 == 1) {
        makeCardName_abi_cxx11_((string *)&i_2,'F',local_18);
        local_69 = 1;
        iVar1 = getCardNumAll((string *)&i_2);
        bVar3 = iVar1 == local_14;
      }
      if ((local_69 & 1) != 0) {
        std::__cxx11::string::~string((string *)&i_2);
      }
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar3) {
        makeCardName_abi_cxx11_(in_RDI,'F',local_18);
        return in_RDI;
      }
    }
    for (local_70 = 1; local_70 < 4; local_70 = local_70 + 1) {
      makeCardName_abi_cxx11_(&local_90,'J',local_70);
      j._3_1_ = 0;
      pmVar2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&my_active_card_abi_cxx11_,&local_90);
      bVar3 = false;
      if (*pmVar2 == 1) {
        makeCardName_abi_cxx11_((string *)&i,'J',local_70);
        j._3_1_ = 1;
        iVar1 = getCardNumAll((string *)&i);
        bVar3 = iVar1 == local_14;
      }
      if ((j._3_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&i);
      }
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar3) {
        makeCardName_abi_cxx11_(in_RDI,'J',local_70);
        return in_RDI;
      }
    }
    local_bc = 9;
    for (local_b8 = 1; local_b8 <= local_bc; local_b8 = local_b8 + 1) {
      makeCardName_abi_cxx11_(&local_e0,'W',local_b8);
      local_101 = 0;
      pmVar2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&my_active_card_abi_cxx11_,&local_e0);
      bVar3 = false;
      if (*pmVar2 == 1) {
        makeCardName_abi_cxx11_(&local_100,'W',local_b8);
        local_101 = 1;
        iVar1 = getCardNumAll(&local_100);
        bVar3 = iVar1 == local_14;
      }
      if ((local_101 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_100);
      }
      std::__cxx11::string::~string((string *)&local_e0);
      if (bVar3) {
        makeCardName_abi_cxx11_(in_RDI,'W',local_b8);
        return in_RDI;
      }
      local_129 = 0;
      local_151 = 0;
      bVar3 = false;
      if (local_bc != local_b8) {
        makeCardName_abi_cxx11_(&local_128,'W',local_bc);
        local_129 = 1;
        pmVar2 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&my_active_card_abi_cxx11_,&local_128);
        bVar3 = false;
        if (*pmVar2 == 1) {
          makeCardName_abi_cxx11_(&local_150,'W',local_bc);
          local_151 = 1;
          iVar1 = getCardNumAll(&local_150);
          bVar3 = iVar1 == local_14;
        }
      }
      if ((local_151 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_150);
      }
      if ((local_129 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_128);
      }
      if (bVar3) {
        makeCardName_abi_cxx11_(in_RDI,'W',local_bc);
        return in_RDI;
      }
      makeCardName_abi_cxx11_(&local_178,'B',local_b8);
      local_199 = 0;
      pmVar2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&my_active_card_abi_cxx11_,&local_178);
      bVar3 = false;
      if (*pmVar2 == 1) {
        makeCardName_abi_cxx11_(&local_198,'B',local_b8);
        local_199 = 1;
        iVar1 = getCardNumAll(&local_198);
        bVar3 = iVar1 == local_14;
      }
      if ((local_199 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_198);
      }
      std::__cxx11::string::~string((string *)&local_178);
      if (bVar3) {
        makeCardName_abi_cxx11_(in_RDI,'B',local_b8);
        return in_RDI;
      }
      local_1c1 = 0;
      local_1e9 = 0;
      bVar3 = false;
      if (local_bc != local_b8) {
        makeCardName_abi_cxx11_(&local_1c0,'B',local_bc);
        local_1c1 = 1;
        pmVar2 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&my_active_card_abi_cxx11_,&local_1c0);
        bVar3 = false;
        if (*pmVar2 == 1) {
          makeCardName_abi_cxx11_(&local_1e8,'B',local_bc);
          local_1e9 = 1;
          iVar1 = getCardNumAll(&local_1e8);
          bVar3 = iVar1 == local_14;
        }
      }
      if ((local_1e9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      if ((local_1c1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      if (bVar3) {
        makeCardName_abi_cxx11_(in_RDI,'B',local_bc);
        return in_RDI;
      }
      makeCardName_abi_cxx11_(&local_210,'T',local_b8);
      local_231 = 0;
      pmVar2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&my_active_card_abi_cxx11_,&local_210);
      bVar3 = false;
      if (*pmVar2 == 1) {
        makeCardName_abi_cxx11_(&local_230,'T',local_b8);
        local_231 = 1;
        iVar1 = getCardNumAll(&local_230);
        bVar3 = iVar1 == local_14;
      }
      if ((local_231 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_230);
      }
      std::__cxx11::string::~string((string *)&local_210);
      if (bVar3) {
        makeCardName_abi_cxx11_(in_RDI,'T',local_b8);
        return in_RDI;
      }
      local_259 = 0;
      local_281 = 0;
      bVar3 = false;
      if (local_bc != local_b8) {
        makeCardName_abi_cxx11_(&local_258,'T',local_bc);
        local_259 = 1;
        pmVar2 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&my_active_card_abi_cxx11_,&local_258);
        bVar3 = false;
        if (*pmVar2 == 1) {
          makeCardName_abi_cxx11_(&local_280,'T',local_bc);
          local_281 = 1;
          iVar1 = getCardNumAll(&local_280);
          bVar3 = iVar1 == local_14;
        }
      }
      if ((local_281 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_280);
      }
      if ((local_259 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_258);
      }
      if (bVar3) {
        makeCardName_abi_cxx11_(in_RDI,'T',local_bc);
        return in_RDI;
      }
      local_bc = local_bc + -1;
    }
    local_14 = local_14 + -1;
  } while( true );
}

Assistant:

string single() {
    setMyCard(my_player_id);
    for (int remain = 3; remain >= 0; remain--) {
        for (int i = 1; i <= 4; i++) {
            if (my_active_card[makeCardName('F', i)] == 1 && getCardNumAll(makeCardName('F', i)) == remain) {
                return makeCardName('F', i);
            }
        }
        for (int i = 1; i <= 3; i++) {
            if (my_active_card[makeCardName('J', i)] == 1 && getCardNumAll(makeCardName('J', i)) == remain) {
                return makeCardName('J', i);
            }
        }
        int i = 1, j = 9;
        for (; i <= j; i++, j--) {
            if (my_active_card[makeCardName('W', i)] == 1 && getCardNumAll(makeCardName('W', i)) == remain) {
                return makeCardName('W', i);
            }
            if (j != i && my_active_card[makeCardName('W', j)] == 1 && getCardNumAll(makeCardName('W', j)) == remain) {
                return makeCardName('W', j);
            }
            if (my_active_card[makeCardName('B', i)] == 1 && getCardNumAll(makeCardName('B', i)) == remain) {
                return makeCardName('B', i);
            }
            if (j != i && my_active_card[makeCardName('B', j)] == 1 && getCardNumAll(makeCardName('B', j)) == remain) {
                return makeCardName('B', j);
            }
            if (my_active_card[makeCardName('T', i)] == 1 && getCardNumAll(makeCardName('T', i)) == remain) {
                return makeCardName('T', i);
            }
            if (j != i && my_active_card[makeCardName('T', j)] == 1 && getCardNumAll(makeCardName('T', j)) == remain) {
                return makeCardName('T', j);
            }
        }
    }

    return "Fail";
    /*
    int i = 1, j = 9;
    for (; i <= j; i++, j--) {
        if (my_active_card[makeCardName('W', i)] == 1) {
            return makeCardName('W', i);
        }
        if (j != i && my_active_card[makeCardName('W', j)] == 1) {
            return makeCardName('W', j);
        }
        if (my_active_card[makeCardName('B', i)] == 1) {
            return makeCardName('B', i);
        }
        if (j != i && my_active_card[makeCardName('B', j)] == 1) {
            return makeCardName('B', j);
        }
        if (my_active_card[makeCardName('T', i)] == 1) {
            return makeCardName('T', i);
        }
        if (j != i && my_active_card[makeCardName('T', j)] == 1) {
            return makeCardName('T', j);
        }
    }*/
    //return "Fail";
}